

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

result_type __thiscall
math::wide_integer::uniform_int_distribution<32u,unsigned_char,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<32u,unsigned_char,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  byte *pbVar1;
  byte *pbVar2;
  char *pcVar3;
  undefined4 uVar4;
  unsigned_fast_type i;
  value_type_conflict4 *pvVar5;
  ushort uVar6;
  long lVar7;
  ushort uVar8;
  uint uVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  bool bVar13;
  result_type range;
  result_type result;
  value_type_conflict4 local_2c [4];
  undefined4 local_28;
  undefined4 local_24;
  array<unsigned_char,_4UL> local_20;
  byte local_1c [4];
  
  pvVar5 = local_20.elems;
  local_20.elems[0] = '\0';
  local_20.elems[1] = '\0';
  local_20.elems[2] = '\0';
  local_20.elems[3] = '\0';
  uVar9 = input_generator->_M_x;
  lVar7 = 0;
  uVar11 = 0;
  do {
    if (lVar7 == 0) {
      uVar12 = (uVar9 % 0xadc8) * 0xbc8f;
      uVar11 = (uVar9 / 0xadc8) * 0xd47;
      uVar9 = (uVar9 / 0xadc8) * -0xd47;
      if (uVar12 < uVar11) {
        uVar9 = uVar11 ^ 0x7fffffff;
      }
      uVar9 = uVar9 + uVar12;
      input_generator->_M_x = uVar9;
      uVar11 = uVar9;
    }
    *pvVar5 = *pvVar5 | (byte)(uVar11 >> ((byte)lVar7 & 0x1f));
    lVar7 = lVar7 + 8;
    pvVar5 = pvVar5 + 1;
  } while (lVar7 != 0x20);
  uVar4._0_3_ = input_params->param_a;
  uVar4._3_1_ = (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  local_2c[0] = (char)(undefined3)uVar4;
  local_2c[1] = (char)((uint3)(undefined3)uVar4 >> 8);
  local_2c[2] = (char)((uint3)(undefined3)uVar4 >> 0x10);
  local_2c[3] = uVar4._3_1_;
  local_28 = 0;
  lVar7 = 3;
  do {
    bVar10 = 0;
    if (lVar7 == -1) break;
    pbVar1 = local_2c + lVar7;
    pbVar2 = (byte *)((long)&local_28 + lVar7);
    bVar10 = -(*pbVar1 <= *pbVar2) | 1;
    lVar7 = lVar7 + -1;
  } while (*pbVar1 == *pbVar2);
  if (bVar10 == 0) {
    local_24 = *(undefined4 *)
                ((input_params->param_b).values.super_array<unsigned_char,_3UL>.elems + 1);
    local_1c[0] = 0xff;
    local_1c[1] = 0xff;
    local_1c[2] = 0xff;
    local_1c[3] = 0xff;
    lVar7 = 3;
    do {
      bVar10 = 0;
      if (lVar7 == -1) break;
      pbVar1 = (byte *)((long)&local_24 + lVar7);
      pbVar2 = local_1c + lVar7;
      bVar10 = -(*pbVar1 <= *pbVar2) | 1;
      lVar7 = lVar7 + -1;
    } while (*pbVar1 == *pbVar2);
    if (bVar10 == 0) goto LAB_00161913;
  }
  local_24 = uVar4;
  local_2c = (value_type_conflict4  [4])
             *(undefined4 *)
              ((input_params->param_b).values.super_array<unsigned_char,_3UL>.elems + 1);
  lVar7 = 0;
  uVar6 = 0;
  do {
    uVar8 = (local_2c[lVar7] - uVar6) - (ushort)*(byte *)((long)&local_24 + lVar7);
    uVar6 = (ushort)(0xff < uVar8);
    local_2c[lVar7] = (value_type_conflict4)uVar8;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  local_28._0_1_ = local_2c[0];
  local_28._1_1_ = local_2c[1];
  local_28._2_1_ = local_2c[2];
  local_28._3_1_ = local_2c[3];
  lVar7 = 0;
  do {
    pcVar3 = (char *)((long)&local_28 + lVar7);
    *pcVar3 = *pcVar3 + '\x01';
    if (*pcVar3 != '\0') break;
    bVar13 = lVar7 != 3;
    lVar7 = lVar7 + 1;
  } while (bVar13);
  local_2c[0] = '\0';
  local_2c[1] = '\0';
  local_2c[2] = '\0';
  local_2c[3] = '\0';
  uintwide_t<32U,_unsigned_char,_void,_false>::eval_divide_knuth
            ((uintwide_t<32U,_unsigned_char,_void,_false> *)&local_20,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_28,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)local_2c);
  local_20.elems[0] = local_2c[0];
  local_20.elems[1] = local_2c[1];
  local_20.elems[2] = local_2c[2];
  local_20.elems[3] = local_2c[3];
  local_2c._0_3_ = input_params->param_a;
  local_2c[3] = (input_params->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  uintwide_t<32U,_unsigned_char,_void,_false>::operator+=
            ((uintwide_t<32U,_unsigned_char,_void,_false> *)&local_20,
             (uintwide_t<24U,_unsigned_char,_void,_false> *)local_2c);
LAB_00161913:
  return (result_type)local_20.elems._0_3_;
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }